

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9MemObjToBool(jx9_value *pObj)

{
  uint uVar1;
  int iVar2;
  char *zLeft;
  jx9_hashmap *pMap;
  sxi32 sVar3;
  anon_union_8_3_18420de5_for_x aVar4;
  sxu32 sVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 8) != 0) {
    return 0;
  }
  if ((uVar1 & 4) != 0) {
    bVar8 = (bool)(-((pObj->x).rVal != 0.0) & 1);
    goto LAB_0011f16b;
  }
  if ((uVar1 & 2) != 0) {
LAB_0011f0b7:
    bVar8 = (pObj->x).iVal == 0;
LAB_0011f0bb:
    bVar8 = !bVar8;
    goto LAB_0011f16b;
  }
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 0x40) != 0) {
        pMap = (jx9_hashmap *)(pObj->x).iVal;
        sVar5 = pMap->nEntry;
        iVar2 = pMap->iRef;
        pMap->iRef = iVar2 + -1;
        if (iVar2 < 2) {
          jx9HashmapRelease(pMap,1);
        }
        bVar8 = sVar5 == 0;
        goto LAB_0011f0bb;
      }
      if ((uVar1 >> 8 & 1) != 0) goto LAB_0011f0b7;
    }
LAB_0011f169:
    bVar8 = false;
    goto LAB_0011f16b;
  }
  uVar1 = (pObj->sBlob).nByte;
  if ((ulong)uVar1 == 0) goto LAB_0011f169;
  zLeft = (char *)(pObj->sBlob).pBlob;
  switch(uVar1) {
  case 2:
    pcVar6 = "on";
    sVar5 = 2;
    break;
  case 3:
    pcVar6 = "yes";
    sVar5 = 3;
    break;
  case 4:
    pcVar6 = "true";
    sVar5 = 4;
    break;
  case 5:
    sVar3 = SyStrnicmp(zLeft,"false",5);
    if (sVar3 == 0) goto LAB_0011f169;
  default:
    goto switchD_0011f105_default;
  }
  sVar3 = SyStrnicmp(zLeft,pcVar6,sVar5);
  if (sVar3 == 0) {
    bVar8 = true;
  }
  else {
switchD_0011f105_default:
    pcVar6 = zLeft;
    do {
      pcVar7 = pcVar6 + 1;
      bVar8 = *pcVar6 != '0';
      if (bVar8) break;
      pcVar6 = pcVar7;
    } while (pcVar7 < zLeft + uVar1);
  }
LAB_0011f16b:
  aVar4.iVal._1_7_ = 0;
  aVar4.iVal._0_1_ = bVar8;
  pObj->x = aVar4;
  SyBlobRelease(&pObj->sBlob);
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToBool(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_BOOL) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjBooleanValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_BOOL);
	}
	return SXRET_OK;
}